

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

uint64_t __thiscall
nivalis::Environment::addr_of(Environment *this,string *var_name,bool mode_explicit)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  size_type sVar4;
  pointer ppVar5;
  byte in_DL;
  ulong in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  const_iterator it;
  int64_t addr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff78;
  unsigned_long local_80;
  ulong local_78;
  _Self local_58;
  _Self local_50;
  string local_48 [32];
  ulong local_28;
  byte local_19;
  ulong local_18;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  std::__cxx11::string::clear();
  pcVar2 = (char *)std::__cxx11::string::operator[](local_18);
  if (*pcVar2 == '&') {
    std::__cxx11::string::substr((ulong)local_48,local_18);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    uVar3 = atoll(pcVar2);
    std::__cxx11::string::~string(local_48);
    if (((long)uVar3 < 0) ||
       (local_28 = uVar3, sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RDI),
       sVar4 <= uVar3)) {
      local_78 = 0xffffffffffffffff;
    }
    else {
      local_78 = local_28;
    }
    return local_78;
  }
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x110a22);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator!=(&local_50,&local_58);
  if (bVar1) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                           *)0x110a5c);
    local_80 = ppVar5->second;
  }
  else {
    local_80 = 0xffffffffffffffff;
  }
  return local_80;
}

Assistant:

uint64_t Environment::addr_of(const std::string& var_name,
        bool mode_explicit) const {
    error_msg.clear();
    if (var_name[0] == '&') {
        // Address
        int64_t addr = std::atoll(var_name.substr(1).c_str());
        return (addr < 0 || static_cast<size_t>(addr) >= vars.size()) ?
            -1 : static_cast<uint64_t>(addr);
    }
    auto it = vreg.find(var_name);
    return it != vreg.end() ? it->second : -1;
}